

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O2

int BitWriterResize(VP8BitWriter *bw,size_t extra_size)

{
  ulong uVar1;
  uint8_t *__dest;
  int iVar2;
  ulong uVar3;
  size_t size;
  
  uVar3 = extra_size + bw->pos_;
  iVar2 = 1;
  if (bw->max_pos_ < uVar3) {
    uVar1 = bw->max_pos_ * 2;
    if (uVar1 <= uVar3) {
      uVar1 = uVar3;
    }
    size = 0x400;
    if (0x400 < uVar1) {
      size = uVar1;
    }
    __dest = (uint8_t *)WebPSafeMalloc(1,size);
    if (__dest == (uint8_t *)0x0) {
      bw->error_ = 1;
      iVar2 = 0;
    }
    else {
      if (bw->pos_ != 0) {
        memcpy(__dest,bw->buf_,bw->pos_);
      }
      WebPSafeFree(bw->buf_);
      bw->buf_ = __dest;
      bw->max_pos_ = size;
    }
  }
  return iVar2;
}

Assistant:

static int BitWriterResize(VP8BitWriter* const bw, size_t extra_size) {
  uint8_t* new_buf;
  size_t new_size;
  const uint64_t needed_size_64b = (uint64_t)bw->pos_ + extra_size;
  const size_t needed_size = (size_t)needed_size_64b;
  if (needed_size_64b != needed_size) {
    bw->error_ = 1;
    return 0;
  }
  if (needed_size <= bw->max_pos_) return 1;
  // If the following line wraps over 32bit, the test just after will catch it.
  new_size = 2 * bw->max_pos_;
  if (new_size < needed_size) new_size = needed_size;
  if (new_size < 1024) new_size = 1024;
  new_buf = (uint8_t*)WebPSafeMalloc(1ULL, new_size);
  if (new_buf == NULL) {
    bw->error_ = 1;
    return 0;
  }
  if (bw->pos_ > 0) {
    assert(bw->buf_ != NULL);
    memcpy(new_buf, bw->buf_, bw->pos_);
  }
  WebPSafeFree(bw->buf_);
  bw->buf_ = new_buf;
  bw->max_pos_ = new_size;
  return 1;
}